

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawDoubleSky4PalCommand,unsigned_int&,unsigned_int&>
               (uint *args,uint *args_1)

{
  DrawDoubleSky4PalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_e8;
  DrawDoubleSky4PalCommand *local_e0;
  DrawDoubleSky4PalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_ba;
  _lambda_void___1_ local_b9;
  undefined1 local_b8 [8];
  DrawDoubleSky4PalCommand command;
  DrawerCommandQueue *queue;
  uint *args_local_1;
  uint *args_local;
  
  command.super_PalSkyCommand._texturefrac._8_8_ = Instance();
  if ((((DrawerCommandQueue *)command.super_PalSkyCommand._texturefrac._8_8_)->threaded_render == 0)
     || (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawDoubleSky4PalCommand::PalSkyCommand
              ((DrawDoubleSky4PalCommand *)local_b8,*args,*args_1);
    tryBlock = QueueCommand(unsigned_int&,unsigned_int&)::{lambda(void*)#1}::
               operator_cast_to_function_pointer(&local_b9);
    catchBlock = QueueCommand(unsigned_int&,unsigned_int&)::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_ba);
    VectoredTryCatch((DrawDoubleSky4PalCommand *)local_b8,tryBlock,catchBlock);
    swrenderer::DrawDoubleSky4PalCommand::~DrawDoubleSky4PalCommand
              ((DrawDoubleSky4PalCommand *)local_b8);
  }
  else {
    command_1 = (DrawDoubleSky4PalCommand *)AllocMemory(0x98);
    if (command_1 == (DrawDoubleSky4PalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.super_PalSkyCommand._texturefrac._8_8_);
      command_1 = (DrawDoubleSky4PalCommand *)AllocMemory(0x98);
      if (command_1 == (DrawDoubleSky4PalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawDoubleSky4PalCommand::PalSkyCommand(command_1,*args,*args_1);
    local_e0 = pDVar1;
    local_e8 = (value_type)pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool +
               command.super_PalSkyCommand._texturefrac._8_8_ + 0x599518),&local_e8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}